

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-cursor.c
# Opt level: O1

int coda_mem_cursor_get_record_field_available_status(coda_cursor *cursor,long index,int *available)

{
  coda_dynamic_type_struct *pcVar1;
  int iVar2;
  
  pcVar1 = cursor->stack[(long)cursor->n + -1].type;
  if (pcVar1[1].backend == coda_backend_ascii) {
    if ((index < 0) || (*(long *)(pcVar1 + 2) <= index)) {
      coda_set_error(-0x65,"field index (%ld) is not in the range [0,%ld)",index,
                     *(undefined8 *)(pcVar1 + 2));
      iVar2 = -1;
    }
    else {
      *available = (uint)(*(long *)(&(pcVar1[2].definition)->format + index * 2) != 0);
      iVar2 = 0;
    }
    return iVar2;
  }
  if (pcVar1[1].backend == 2) {
    iVar2 = coda_ascbin_cursor_get_record_field_available_status(cursor,index,available);
    return iVar2;
  }
  __assert_fail("type->tag == tag_mem_record",
                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-cursor.c"
                ,0x16c,
                "int coda_mem_cursor_get_record_field_available_status(const coda_cursor *, long, int *)"
               );
}

Assistant:

int coda_mem_cursor_get_record_field_available_status(const coda_cursor *cursor, long index, int *available)
{
    coda_mem_type *type = (coda_mem_type *)cursor->stack[cursor->n - 1].type;

    if (type->tag == tag_mem_data)
    {
        return coda_ascbin_cursor_get_record_field_available_status(cursor, index, available);
    }

    assert(type->tag == tag_mem_record);
    if (index < 0 || index >= ((coda_mem_record *)type)->num_fields)
    {
        coda_set_error(CODA_ERROR_INVALID_INDEX, "field index (%ld) is not in the range [0,%ld)", index,
                       ((coda_mem_record *)type)->num_fields);
        return -1;
    }
    *available = (((coda_mem_record *)type)->field_type[index] != NULL);

    return 0;

}